

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O0

void __thiscall
ConfidentialTransactionContext_SetAssetReissuanceTest1_Test::TestBody
          (ConfidentialTransactionContext_SetAssetReissuanceTest1_Test *this)

{
  bool bVar1;
  BlindFactor *blind_factor_00;
  char *pcVar2;
  char *rhs;
  Amount AVar3;
  AssertionResult gtest_ar;
  IssuanceOutputParameter issue_output;
  IssuanceParameter param;
  BlindFactor entropy;
  BlindFactor blind_factor;
  ElementsConfidentialAddress address;
  Amount amount;
  Txid txid;
  ConfidentialTransactionContext tx;
  ConfidentialTransactionContext expect_tx;
  ConfidentialTransactionContext tx_base;
  string *in_stack_fffffffffffff538;
  IssuanceParameter *pIVar4;
  IssuanceOutputParameter *in_stack_fffffffffffff540;
  undefined6 in_stack_fffffffffffff560;
  undefined1 in_stack_fffffffffffff566;
  undefined1 in_stack_fffffffffffff567;
  IssuanceOutputParameter *issue_output_00;
  ConfidentialTransactionContext *context;
  ConfidentialTransactionContext *this_00;
  AssertHelper in_stack_fffffffffffff5a8;
  Message local_a50;
  string local_a48 [8];
  BlindFactor *in_stack_fffffffffffff5c0;
  string local_a28;
  AssertionResult local_a08;
  AssertHelper local_9f8;
  Message local_9f0 [2];
  OutPoint local_9e0 [13];
  ElementsConfidentialAddress local_7d0;
  BlindFactor *local_5e8;
  undefined1 local_5e0;
  allocator local_559;
  string local_558;
  undefined1 local_538 [40];
  string local_510;
  BlindFactor local_4f0;
  allocator local_4c9;
  string local_4c8;
  ElementsConfidentialAddress local_4a8;
  BlindFactor *local_2f8;
  undefined1 local_2f0;
  BlindFactor *local_2e8;
  undefined1 local_2e0;
  undefined1 local_2d1 [256];
  undefined1 local_1d1 [33];
  AbstractTransaction local_1b0 [12];
  undefined1 local_e1 [225];
  
  this_00 = (ConfidentialTransactionContext *)local_e1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_e1 + 1),
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000"
             ,(allocator *)this_00);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  std::__cxx11::string::~string((string *)(local_e1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_e1);
  context = (ConfidentialTransactionContext *)local_1d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)(local_1d1 + 1),
             "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000"
             ,(allocator *)context);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540,in_stack_fffffffffffff538);
  std::__cxx11::string::~string((string *)(local_1d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_1d1);
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(this_00,context);
  issue_output_00 = (IssuanceOutputParameter *)local_2d1;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)((long)local_2d1 + 1),
             "8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e",
             (allocator *)issue_output_00);
  cfd::core::Txid::Txid((Txid *)((long)local_2d1 + 0x21),(string *)((long)local_2d1 + 1));
  std::__cxx11::string::~string((string *)((long)local_2d1 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_2d1);
  AVar3 = cfd::core::Amount::CreateByCoinAmount(7.0);
  blind_factor_00 = (BlindFactor *)AVar3.amount_;
  local_2f0 = AVar3.ignore_check_;
  local_2f8 = blind_factor_00;
  local_2e8 = blind_factor_00;
  local_2e0 = local_2f0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_4c8,
             "CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3",
             &local_4c9);
  cfd::core::ElementsConfidentialAddress::ElementsConfidentialAddress(&local_4a8,&local_4c8);
  std::__cxx11::string::~string((string *)&local_4c8);
  std::allocator<char>::~allocator((allocator<char> *)&local_4c9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_510,"c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf"
             ,(allocator *)(local_538 + 0x27));
  cfd::core::BlindFactor::BlindFactor(&local_4f0,&local_510);
  std::__cxx11::string::~string((string *)&local_510);
  std::allocator<char>::~allocator((allocator<char> *)(local_538 + 0x27));
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_558,"6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306"
             ,&local_559);
  cfd::core::BlindFactor::BlindFactor((BlindFactor *)local_538,&local_558);
  std::__cxx11::string::~string((string *)&local_558);
  std::allocator<char>::~allocator((allocator<char> *)&local_559);
  cfd::core::IssuanceParameter::IssuanceParameter
            ((IssuanceParameter *)
             CONCAT17(in_stack_fffffffffffff567,
                      CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)));
  cfd::IssuanceOutputParameter::IssuanceOutputParameter
            ((IssuanceOutputParameter *)
             CONCAT17(in_stack_fffffffffffff567,
                      CONCAT16(in_stack_fffffffffffff566,in_stack_fffffffffffff560)));
  cfd::core::ElementsConfidentialAddress::operator=(&local_7d0,&local_4a8);
  local_5e0 = local_2e0;
  local_5e8 = local_2e8;
  bVar1 = testing::internal::AlwaysTrue();
  if (bVar1) {
    bVar1 = testing::internal::AlwaysTrue();
    if (bVar1) {
      cfd::core::OutPoint::OutPoint(local_9e0,(Txid *)((long)local_2d1 + 0x21),2);
      pIVar4 = (IssuanceParameter *)local_538;
      cfd::ConfidentialTransactionContext::SetAssetReissuance
                ((ConfidentialTransactionContext *)in_stack_fffffffffffff5a8.data_,
                 (OutPoint *)this_00,(Amount *)context,issue_output_00,blind_factor_00,
                 in_stack_fffffffffffff5c0);
      cfd::core::IssuanceParameter::operator=((IssuanceParameter *)in_stack_fffffffffffff540,pIVar4)
      ;
      cfd::core::IssuanceParameter::~IssuanceParameter
                ((IssuanceParameter *)in_stack_fffffffffffff540);
      cfd::core::OutPoint::~OutPoint((OutPoint *)0x21aacd);
    }
  }
  else {
    testing::Message::Message(local_9f0);
    testing::internal::AssertHelper::AssertHelper
              (&local_9f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xf2,
               "Expected: (param = tx.SetAssetReissuance(OutPoint(txid, 2), amount, issue_output, blind_factor, entropy)) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=(&local_9f8,local_9f0);
    testing::internal::AssertHelper::~AssertHelper(&local_9f8);
    testing::Message::~Message((Message *)0x21adf0);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_
            (&local_a28,(AbstractTransaction *)((long)local_2d1 + 0x41));
  pcVar2 = (char *)std::__cxx11::string::c_str();
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)local_a48,local_1b0);
  rhs = (char *)std::__cxx11::string::c_str();
  testing::internal::CmpHelperSTREQ
            ((internal *)&local_a08,"tx.GetHex().c_str()","expect_tx.GetHex().c_str()",pcVar2,rhs);
  std::__cxx11::string::~string(local_a48);
  std::__cxx11::string::~string((string *)&local_a28);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a08);
  if (!bVar1) {
    testing::Message::Message(&local_a50);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x21af64);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&stack0xfffffffffffff5a8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0xf3,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&stack0xfffffffffffff5a8,&local_a50);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&stack0xfffffffffffff5a8);
    testing::Message::~Message((Message *)0x21afb2);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x21b004);
  cfd::IssuanceOutputParameter::~IssuanceOutputParameter(in_stack_fffffffffffff540);
  cfd::core::IssuanceParameter::~IssuanceParameter((IssuanceParameter *)in_stack_fffffffffffff540);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x21b02b);
  cfd::core::BlindFactor::~BlindFactor((BlindFactor *)0x21b038);
  cfd::core::ElementsConfidentialAddress::~ElementsConfidentialAddress
            ((ElementsConfidentialAddress *)in_stack_fffffffffffff540);
  cfd::core::Txid::~Txid((Txid *)0x21b052);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540);
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext
            ((ConfidentialTransactionContext *)in_stack_fffffffffffff540);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, SetAssetReissuanceTest1)
{
    ConfidentialTransactionContext tx_base(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200000000ffffffff03017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000000000000");
    ConfidentialTransactionContext expect_tx(
        "0200000000025e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0000000000ffffffff5e67a3542db02871642bdf0923d33ac5bd1105f3421520297f01617c6323918d0200008000ffffffffcf9a1b9aeb2de6a7b7c3177433dced0951fd728dffbe8c935ccb80698f2e08c80683fe0819a4f9770c8a7cd5824e82975c825e017aff8ba0d6a5eb4959cf9c6f010000000029b927000004017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000029b9270003f4f10478f5fae2c77c44fdb2a304109a9ae8ba7cab1c125deba9e618ca737e851976a91484c2ef274919355bb532a5bbdbfa95490c5d749388ac017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c1801000000003b97049c03b69e5ef61aef08565404bc3c98d6e4dfd1e02eb94138617d9b3eb12ec790885317a91401e940d9dcd77a5043356941641aa2fd6ec6a68887017981c1f171d7973a1fd922652f559f47d6d1506a4be2394b27a54951957f6c18010000000000002710000001cdb0ed311810e61036ac9255674101497850f5eee5e4320be07479c05473cbac010000000029b9270003f234757d0e00e6a7a7a3b4b2b31fb0328d7b9f755cd1093d9f61892fef3116871976a91435ef6d4b59f26089dfe2abca21408e15fee42a3388ac00000000");

    // not blind
    ConfidentialTransactionContext tx(tx_base);
    Txid txid("8d9123637c61017f29201542f30511bdc53ad32309df2b647128b02d54a3675e");
    Amount amount = Amount::CreateByCoinAmount(7.0);
    ElementsConfidentialAddress address("CTEyBCf1WzQDpbv6sXLTnFaknGK2UJMHqjyGJjQGq9NEytBR2JLHR9cHJSk4MbLVcKQYWsWERUEYN6R3");
    BlindFactor blind_factor("c8082e8f6980cb5c938cbeff8d72fd5109eddc337417c3b7a7e62deb9a1b9acf");
    BlindFactor entropy("6f9ccf5949eba5d6a08bff7a015e825c97824e82d57c8a0c77f9a41908fe8306");

    IssuanceParameter param;
    IssuanceOutputParameter issue_output;
    issue_output.confidential_address = address;
    issue_output.amount = amount;
    EXPECT_NO_THROW(
        (param = tx.SetAssetReissuance(OutPoint(txid, 2), amount,
                                       issue_output, blind_factor, entropy)));
    EXPECT_STREQ(tx.GetHex().c_str(), expect_tx.GetHex().c_str());
}